

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_145302::StatTask::start(StatTask *this,TaskInterface ti)

{
  BuildKey *this_00;
  char *pcVar1;
  StringRef path;
  BuildKey local_70;
  KeyType local_50;
  StatTask *local_30;
  StatTask *this_local;
  TaskInterface ti_local;
  
  ti_local.impl = ti.ctx;
  this_local = (StatTask *)ti.impl;
  local_30 = this;
  ti_local.ctx = llbuild::buildsystem::StatNode::getName_abi_cxx11_(this->statnode);
  this_00 = (BuildKey *)std::__cxx11::string::data();
  pcVar1 = (char *)std::__cxx11::string::length();
  path.Length = (size_t)pcVar1;
  path.Data = pcVar1;
  llbuild::buildsystem::BuildKey::makeNode(&local_70,this_00,path);
  llbuild::buildsystem::BuildKey::toData(&local_50,&local_70);
  llbuild::core::TaskInterface::mustFollow((TaskInterface *)&this_local,&local_50);
  llbuild::core::KeyType::~KeyType(&local_50);
  llbuild::buildsystem::BuildKey::~BuildKey(&local_70);
  return;
}

Assistant:

virtual void start(TaskInterface ti) override {
    // Create a weak link on any potential producer nodes so that we get up to
    // date stat information. We always run (see isResultValid) so this should
    // be safe (unlike directory contents where it may not run).
    ti.mustFollow(BuildKey::makeNode(statnode.getName()).toData());
  }